

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_cookie_clearsess(CookieInfo *ci)

{
  Curl_llist_node *pCVar1;
  Cookie *co;
  long lVar2;
  Curl_llist_node *n;
  
  if (ci != (CookieInfo *)0x0) {
    for (lVar2 = 0; lVar2 != 0x3f; lVar2 = lVar2 + 1) {
      pCVar1 = Curl_llist_head(ci->cookielist + lVar2);
      while (n = pCVar1, n != (Curl_llist_node *)0x0) {
        co = (Cookie *)Curl_node_elem(n);
        pCVar1 = Curl_node_next(n);
        if (co->expires == 0) {
          Curl_node_remove(n);
          freecookie(co);
          ci->numcookies = ci->numcookies + -1;
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_cookie_clearsess(struct CookieInfo *ci)
{
  unsigned int i;

  if(!ci)
    return;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Curl_llist_node *n = Curl_llist_head(&ci->cookielist[i]);
    struct Curl_llist_node *e = NULL;

    for(; n; n = e) {
      struct Cookie *curr = Curl_node_elem(n);
      e = Curl_node_next(n); /* in case the node is removed, get it early */
      if(!curr->expires) {
        Curl_node_remove(n);
        freecookie(curr);
        ci->numcookies--;
      }
    }
  }
}